

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O1

int pospopcnt_u16_avx512_masked_ops(uint16_t *data,uint32_t len,uint32_t *flags)

{
  uint32_t in_EAX;
  ulong uVar1;
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  
  if (len == 0) {
    auVar2 = ZEXT1664((undefined1  [16])0x0);
    len = in_EAX;
  }
  else {
    auVar2 = ZEXT1664((undefined1  [16])0x0);
    uVar1 = 0;
    do {
      auVar3 = vpmovm2d_avx512dq((ulong)data[uVar1]);
      auVar2 = vpsubd_avx512f(auVar2,auVar3);
      uVar1 = uVar1 + 1;
    } while (len != uVar1);
  }
  auVar2 = vmovdqu64_avx512f(auVar2);
  *(undefined1 (*) [64])flags = auVar2;
  return len;
}

Assistant:

int pospopcnt_u16_avx512_masked_ops(const uint16_t* data, uint32_t len, uint32_t* flags) {
    __m512i counter = _mm512_setzero_si512();
    __m512i ones = _mm512_set1_epi32(1);

    for (int i = 0; i < len; ++i) {
        counter = _mm512_mask_add_epi32(counter, data[i], counter, ones);
    }

    _mm512_storeu_si512((__m512i*)flags, counter);
}